

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall TimerHeap::TimerHeap(TimerHeap *this,EventLoop *loop)

{
  EventLoop *this_00;
  int iVar1;
  Channel *this_01;
  function<void_()> local_b0;
  code *local_90;
  undefined8 local_88;
  _Bind<void_(EventLoop::*(EventLoop_*,_std::shared_ptr<Channel>))(std::shared_ptr<Channel>)>
  local_80;
  Functor local_58;
  undefined1 local_38 [8];
  ChannelPtr channel;
  
  iVar1 = timerfd_create(1,0x80800);
  this->timerfd_ = iVar1;
  this->loop_ = loop;
  (this->timerMap_)._M_h._M_buckets = &(this->timerMap_)._M_h._M_single_bucket;
  (this->timerMap_)._M_h._M_bucket_count = 1;
  (this->timerMap_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->timerMap_)._M_h._M_element_count = 0;
  (this->timerMap_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->timerHeap_).
  super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->timerMap_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->timerMap_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->timerHeap_).
  super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->timerHeap_).
  super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (iVar1 != -1) {
    bzero(&this->howlong_,0x20);
    this_01 = (Channel *)operator_new(0xa8);
    Channel::Channel(this_01,this->loop_,this->timerfd_);
    std::__shared_ptr<Channel,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Channel,void>
              ((__shared_ptr<Channel,(__gnu_cxx::_Lock_policy)2> *)local_38,this_01);
    *(int *)((long)local_38 + 0x1c) = -0x7fffffff;
    local_80._M_f = (offset_in_EventLoop_to_subr)handleTimeout;
    local_80._8_8_ = 0;
    local_80._M_bound_args.super__Tuple_impl<0UL,_EventLoop_*,_std::shared_ptr<Channel>_>.
    super__Tuple_impl<1UL,_std::shared_ptr<Channel>_>.
    super__Head_base<1UL,_std::shared_ptr<Channel>,_false>._M_head_impl.
    super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    std::function<void()>::function<std::_Bind<void(TimerHeap::*(TimerHeap*))()>,void>
              ((function<void()> *)&local_b0,(_Bind<void_(TimerHeap::*(TimerHeap_*))()> *)&local_80)
    ;
    std::function<void_()>::operator=((EventCallback *)((long)local_38 + 0x28),&local_b0);
    std::_Function_base::~_Function_base(&local_b0.super__Function_base);
    this_00 = this->loop_;
    local_90 = EventLoop::addChannel;
    local_88 = 0;
    std::_Bind<void(EventLoop::*(EventLoop*,std::shared_ptr<Channel>))(std::shared_ptr<Channel>)>::
    _Bind<EventLoop*&,std::shared_ptr<Channel>&>
              ((_Bind<void(EventLoop::*(EventLoop*,std::shared_ptr<Channel>))(std::shared_ptr<Channel>)>
                *)&local_80,(offset_in_EventLoop_to_subr *)&local_90,&this->loop_,
               (shared_ptr<Channel> *)local_38);
    std::function<void()>::
    function<std::_Bind<void(EventLoop::*(EventLoop*,std::shared_ptr<Channel>))(std::shared_ptr<Channel>)>,void>
              ((function<void()> *)&local_58,&local_80);
    EventLoop::runInLoop(this_00,&local_58);
    std::_Function_base::~_Function_base(&local_58.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_80._M_bound_args.
                       super__Tuple_impl<0UL,_EventLoop_*,_std::shared_ptr<Channel>_>.
                       super__Tuple_impl<1UL,_std::shared_ptr<Channel>_>.
                       super__Head_base<1UL,_std::shared_ptr<Channel>,_false>._M_head_impl + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&channel);
    return;
  }
  __assert_fail("timerfd_ != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/Timer.cpp"
                ,0x14,"TimerHeap::TimerHeap(EventLoop *)");
}

Assistant:

TimerHeap::TimerHeap(EventLoop* loop) 
    : timerfd_(timerfd_create(CLOCK_MONOTONIC, TFD_NONBLOCK | TFD_CLOEXEC)),
      loop_(loop) {
    assert(timerfd_ != -1);
    bzero(&howlong_, sizeof howlong_);
    ChannelPtr channel(new Channel(loop_, timerfd_));
    channel->setEvent(EPOLLIN | EPOLLET);
    channel->setReadCallback(std::bind(&TimerHeap::handleTimeout, this));
    loop_->runInLoop(std::bind(&EventLoop::addChannel, loop_, channel));
}